

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

ImageFeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_imagetype(FeatureType *this)

{
  ImageFeatureType *pIVar1;
  ImageFeatureType *_msg;
  FeatureType *this_local;
  
  pIVar1 = _internal_mutable_imagetype(this);
  return pIVar1;
}

Assistant:

inline ::CoreML::Specification::ImageFeatureType* FeatureType::mutable_imagetype() {
  ::CoreML::Specification::ImageFeatureType* _msg = _internal_mutable_imagetype();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.imageType)
  return _msg;
}